

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

void render_line_mode4(gba_ppu_t *ppu)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  int x;
  DISPCNT_t DVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  byte bVar19;
  ushort uVar20;
  uint uVar21;
  gba_color_t *pgVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  bool bVar34;
  _Bool bg_enabled [4];
  byte local_8a [4];
  byte local_86;
  byte local_85;
  _Bool bg_top [6];
  ushort local_60;
  
  DVar6 = ppu->DISPCNT;
  if (((uint)DVar6 >> 0xc & 1) != 0) {
    render_obj(ppu);
    DVar6._2_2_ = 0;
    DVar6.raw = (ppu->DISPCNT).raw;
  }
  if (((uint)DVar6 >> 10 & 1) == 0) {
    for (lVar9 = 0; lVar9 != 0xf0; lVar9 = lVar9 + 1) {
      ppu->bgbuf[2][lVar9].raw = *(ushort *)ppu->pram | 0x8000;
    }
  }
  else {
    uVar1 = ppu->y;
    for (lVar9 = 0; lVar9 != 0xf0; lVar9 = lVar9 + 1) {
      pgVar22 = ppu->bgbuf[2] + (ulong)uVar1 * 0x78;
      if (((uint)ppu->DISPCNT & 0x10) != 0) {
        pgVar22 = (gba_color_t *)(ppu->vram + (ulong)uVar1 * 0xf0 + 0x9390);
      }
      uVar31 = (ulong)*(byte *)((long)pgVar22 + lVar9 + 0xc70);
      if (uVar31 == 0) {
        uVar20 = *(ushort *)ppu->pram | 0x8000;
      }
      else {
        uVar20 = *(ushort *)(ppu->pram + uVar31 * 2) & 0x7fff;
      }
      ppu->bgbuf[2][lVar9].raw = uVar20;
    }
  }
  dbg_line_drawn();
  refresh_background_priorities(ppu);
  uVar31 = 0;
  uVar23 = (ppu->BLDALPHA).raw & 0x1f;
  uVar21 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
  uVar29 = (ppu->BLDY).raw & 0x1f;
  if (0xf < (ushort)uVar29) {
    uVar29 = 0x10;
  }
  bVar15 = (byte)((ppu->DISPCNT).raw >> 8);
  bg_enabled[0] = (_Bool)(bVar15 & 1);
  bg_enabled[1] = (_Bool)(bVar15 >> 1 & 1);
  bg_enabled[2] = (_Bool)(bVar15 >> 2 & 1);
  bg_enabled[3] = (_Bool)(bVar15 >> 3 & 1);
  bVar15 = (byte)(ppu->BLDCNT).raw;
  bg_top[0] = (_Bool)(bVar15 & 1);
  bg_top[1] = (_Bool)(bVar15 >> 1 & 1);
  bg_top[2] = (_Bool)(bVar15 >> 2 & 1);
  bg_top[3] = (_Bool)(bVar15 >> 3 & 1);
  bg_top[4] = (_Bool)(bVar15 >> 4 & 1);
  bg_top[5] = (_Bool)(bVar15 >> 5 & 1);
  bVar15 = (byte)((ppu->BLDCNT).raw >> 8);
  local_8a[0] = bVar15 & 1;
  local_8a[1] = bVar15 >> 1 & 1;
  local_8a[2] = bVar15 >> 2 & 1;
  local_8a[3] = bVar15 >> 3 & 1;
  local_86 = bVar15 >> 4 & 1;
  local_85 = bVar15 >> 5 & 1;
  uVar1 = *(ushort *)ppu->pram;
  uVar20 = ppu->y;
  if (0xf < (ushort)uVar21) {
    uVar21 = 0x10;
  }
  uVar12 = (uint)(byte)(0x10 - (char)uVar29);
  if (0xf < (ushort)uVar23) {
    uVar23 = 0x10;
  }
  do {
    if (uVar31 == 0xf0) {
      return;
    }
    if ((byte)(ppu->WIN0H).raw < uVar31 || uVar31 < (ppu->WIN0H).raw >> 8) {
      bVar34 = false;
    }
    else {
      bVar34 = uVar20 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar20;
    }
    if ((byte)(ppu->WIN1H).raw < uVar31 || uVar31 < (ppu->WIN1H).raw >> 8) {
      bVar10 = false;
    }
    else {
      bVar10 = uVar20 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar20;
    }
    uVar2 = (ppu->DISPCNT).raw;
    bVar15 = (byte)(uVar2 >> 8);
    if ((bVar15 >> 5 & 1 & bVar34) == 1) {
      bVar15 = *(byte *)&ppu->WININ;
LAB_001159e8:
      uVar5 = (ushort)(bVar15 >> 5);
    }
    else {
      if ((bVar15 >> 6 & 1 & bVar10) == 1) {
        uVar5 = (ppu->WININ).raw;
      }
      else {
        if (((short)uVar2 < 0 & ppu->obj_window[uVar31]) != 1) {
          uVar5 = 1;
          if ((uVar2 & 0x6000) != 0 && (bVar34 == false && bVar10 == false)) {
            bVar15 = *(byte *)&ppu->WINOUT;
            goto LAB_001159e8;
          }
          goto LAB_00115a30;
        }
        uVar5 = (ppu->WINOUT).raw;
      }
      uVar5 = uVar5 >> 0xd;
    }
LAB_00115a30:
    uVar2 = (ppu->BLDCNT).raw;
    uVar11 = uVar2 >> 6 & 3;
    local_60 = uVar2 & 0xc0;
    iVar24 = (black.raw & 0x1f) * uVar29;
    iVar25 = (black.raw >> 5 & 0x1f) * uVar29;
    iVar16 = (black.raw >> 10 & 0x1f) * uVar29;
    iVar26 = (white.raw & 0x1f) * uVar29;
    iVar27 = (white.raw >> 5 & 0x1f) * uVar29;
    iVar17 = (white.raw >> 10 & 0x1f) * uVar29;
    uVar8 = (uint)uVar1;
    iVar7 = 5;
    uVar28 = uVar8;
    for (uVar33 = 3; -1 < (int)uVar33; uVar33 = uVar33 - 1) {
      iVar4 = background_priorities[uVar33];
      bVar15 = local_8a[iVar7];
      if ((uVar5 & 1) == 0) {
        bVar18 = 0;
      }
      else {
        bVar18 = (local_60 == 0x40 & bVar15 | (char)uVar2 < '\0') & bg_top[iVar4];
      }
      uVar3 = ppu->bgbuf[iVar4][uVar31].raw;
      bVar19 = -1 < (short)uVar3 & bg_enabled[iVar4];
      uVar13 = (uint)uVar3;
      if ((bVar19 == 1) && (bVar18 != 0)) {
        switch(uVar11) {
        case 0:
          uVar14 = 0x229;
          goto LAB_00115efb;
        case 1:
          uVar32 = 0x1f;
          uVar8 = (uVar13 & 0x1f) * uVar23 + (uVar28 & 0x1f) * uVar21 >> 4;
          if (0x1e < (ushort)uVar8) {
            uVar8 = uVar32;
          }
          uVar30 = (uVar3 >> 5 & 0x1f) * uVar23 + (uVar28 >> 5 & 0x1f) * uVar21 >> 4;
          if (0x1e < (ushort)uVar30) {
            uVar30 = uVar32;
          }
          uVar28 = (uVar3 >> 10) * uVar23 + (uVar28 >> 10 & 0x1f) * uVar21 >> 4;
          if (0x1e < (ushort)uVar28) {
            uVar28 = uVar32;
          }
          uVar32 = uVar28 << 10 | uVar30 << 5 | uVar8;
          goto LAB_00115cab;
        case 2:
          uVar8 = (uVar3 & 0x1f) * uVar12 + iVar26 >> 4;
          if (0x1e < uVar8) {
            uVar8 = 0x1f;
          }
          uVar28 = (uVar3 >> 5 & 0x1f) * uVar12 + iVar27 >> 4;
          if (0x1e < uVar28) {
            uVar28 = 0x1f;
          }
          uVar32 = (uVar3 >> 10) * uVar12 + iVar17;
          break;
        case 3:
          uVar8 = (uVar3 & 0x1f) * uVar12 + iVar24 >> 4;
          if (0x1e < uVar8) {
            uVar8 = 0x1f;
          }
          uVar28 = (uVar3 >> 5 & 0x1f) * uVar12 + iVar25 >> 4;
          if (0x1e < uVar28) {
            uVar28 = 0x1f;
          }
          uVar32 = (uVar3 >> 10) * uVar12 + iVar16;
        }
        uVar30 = uVar32 >> 4;
        if (0x1e < uVar32 >> 4) {
          uVar30 = 0x1f;
        }
        uVar32 = uVar8 | uVar30 << 10 | uVar28 << 5;
LAB_00115cab:
        uVar8 = uVar32;
        uVar30 = uVar13;
        iVar7 = iVar4;
      }
      else {
        uVar32 = uVar13;
        uVar30 = uVar28;
        if (bVar19 != 0) goto LAB_00115cab;
      }
      uVar28 = uVar30;
      if (uVar33 == ppu->obj_priorities[uVar31]) {
        uVar3 = ppu->objbuf[uVar31].raw;
        bVar34 = -1 < (short)uVar3;
        uVar13 = (uint)uVar3;
        if (bVar34) {
          uVar8 = uVar13;
        }
        if (bVar34) {
          uVar28 = uVar13;
          iVar7 = 4;
        }
        if ((byte)(bVar34 & ppu->obj_alpha[uVar31] & ((char)uVar2 < '\0' | bVar15)) == 1) {
          if (bVar15 == 0) {
            switch(uVar11) {
            case 0:
              uVar14 = 0x246;
LAB_00115efb:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                      ,uVar14);
              fwrite("Determined we should blend even though blending was off?\n\x1b[0;m",0x3e,1,
                     _stderr);
              exit(1);
            case 1:
              goto switchD_00115d12_caseD_1;
            case 2:
              uVar8 = (uVar3 & 0x1f) * uVar12 + iVar26 >> 4;
              if (0x1e < uVar8) {
                uVar8 = 0x1f;
              }
              uVar28 = (uVar3 >> 5 & 0x1f) * uVar12 + iVar27 >> 4;
              if (0x1e < uVar28) {
                uVar28 = 0x1f;
              }
              uVar13 = (uVar3 >> 10) * uVar12 + iVar17;
              break;
            case 3:
              uVar8 = (uVar13 & 0x1f) * uVar12 + iVar24 >> 4;
              if (0x1e < uVar8) {
                uVar8 = 0x1f;
              }
              uVar28 = (uVar3 >> 5 & 0x1f) * uVar12 + iVar25 >> 4;
              if (0x1e < uVar28) {
                uVar28 = 0x1f;
              }
              uVar13 = (uVar3 >> 10) * uVar12 + iVar16;
            }
            uVar32 = uVar13 >> 4;
            if (0x1e < uVar13 >> 4) {
              uVar32 = 0x1f;
            }
            uVar8 = uVar8 | uVar32 << 10 | uVar28 << 5;
          }
          else {
switchD_00115d12_caseD_1:
            uVar28 = 0x1f;
            uVar8 = (uVar3 & 0x1f) * uVar23 + (uVar30 & 0x1f) * uVar21 >> 4;
            if (0x1e < (ushort)uVar8) {
              uVar8 = uVar28;
            }
            uVar13 = (uVar3 >> 5 & 0x1f) * uVar23 + (uVar30 >> 5 & 0x1f) * uVar21 >> 4;
            if (0x1e < (ushort)uVar13) {
              uVar13 = uVar28;
            }
            uVar32 = (uVar3 >> 10) * uVar23 + (uVar30 >> 10 & 0x1f) * uVar21 >> 4;
            if (0x1e < (ushort)uVar32) {
              uVar32 = uVar28;
            }
            uVar8 = uVar32 << 10 | uVar13 << 5 | uVar8;
          }
          iVar7 = 4;
          uVar28 = (uint)uVar3;
        }
      }
    }
    ppu->screen[uVar20][uVar31].a = 0xff;
    ppu->screen[uVar20][uVar31].r = ((byte)uVar8 & 7) + (byte)uVar8 * '\b';
    bVar15 = (byte)((uVar8 & 0xffff) >> 5);
    ppu->screen[uVar20][uVar31].g = (bVar15 & 7) + bVar15 * '\b';
    bVar15 = (byte)((uVar8 & 0xffff) >> 10);
    ppu->screen[uVar20][uVar31].b = (bVar15 & 7) + bVar15 * '\b';
    uVar31 = uVar31 + 1;
  } while( true );
}

Assistant:

void render_line_mode4(gba_ppu_t* ppu) {
    if (ppu->DISPCNT.screen_display_obj) {
        render_obj(ppu);
    }
    if (ppu->DISPCNT.screen_display_bg2) {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            int offset = x + (ppu->y * GBA_SCREEN_X);
            int index = ppu->DISPCNT.display_frame_select * 0xA000 + offset;
            int tile = ppu->vram[index];
            if (tile == 0) {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
                ppu->bgbuf[2][x].transparent = true;
            } else {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, (0x20 * PALETTE_BANK_BACKGROUND + 2 * tile)) & 0x7FFF;
                ppu->bgbuf[2][x].transparent = false;
            }
        }
    } else {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
            ppu->bgbuf[2][x].transparent = true;
        }
    }

    dbg_line_drawn();
    refresh_background_priorities(ppu);
    merge_bgs(ppu);
}